

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmetaobject.cpp
# Opt level: O0

ssize_t __thiscall
QDBusMetaObjectGenerator::write(QDBusMetaObjectGenerator *this,int __fd,void *__buf,size_t __n)

{
  quint32 qVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  Int IVar5;
  value_type_conflict1 vVar6;
  value_type_conflict1 vVar7;
  int iVar8;
  qsizetype qVar9;
  qsizetype qVar10;
  size_type_conflict sVar11;
  size_type_conflict sVar12;
  uint *puVar13;
  size_type_conflict sVar14;
  size_type_conflict sVar15;
  size_type sVar16;
  iterator pvVar17;
  Method *pMVar18;
  reference pvVar19;
  size_type sVar20;
  longlong *plVar21;
  ulong uVar22;
  QMetaType *pQVar23;
  long lVar24;
  int *piVar25;
  char *pcVar26;
  Property *pPVar27;
  void *pvVar28;
  void *pvVar29;
  QVarLengthArray<unsigned_int,_256LL> *this_00;
  undefined4 in_register_00000034;
  undefined8 *puVar30;
  long in_FS_OFFSET;
  QLatin1StringView QVar31;
  QLatin1String QVar32;
  uint *uint_data;
  char *string_data;
  Property *mp;
  QByteArray *name;
  QKeyValueRange<const_QMap<QByteArray,_QDBusMetaObjectGenerator::Property>_&> *__range1_3;
  qsizetype i_1;
  int typeInfo;
  int type;
  qsizetype i;
  qsizetype argc_1;
  Method *mm_2;
  QMap<QByteArray,_QDBusMetaObjectGenerator::Method> *__range2_2;
  value_type *methodMap_2;
  iterator __end1_2;
  iterator __begin1_2;
  array<std::reference_wrapper<const_QMap<QByteArray,_QDBusMetaObjectGenerator::Method>_>,_2UL>
  *__range1_2;
  qsizetype currentMethodMetaTypeOffset;
  int propertyId;
  QMetaType *metaTypes;
  qsizetype argc;
  Method *mm_1;
  QMap<QByteArray,_QDBusMetaObjectGenerator::Method> *__range2_1;
  value_type *methodMap_1;
  iterator __end1_1;
  iterator __begin1_1;
  array<std::reference_wrapper<const_QMap<QByteArray,_QDBusMetaObjectGenerator::Method>_>,_2UL>
  *__range1_1;
  qsizetype totalMetaTypeCount;
  qsizetype typeidOffset;
  qsizetype signatureOffset;
  qsizetype parametersOffset;
  qsizetype offset;
  Method *mm;
  QMap<QByteArray,_QDBusMetaObjectGenerator::Method> *__range2;
  value_type *methodMap;
  iterator __end1;
  iterator __begin1;
  array<std::reference_wrapper<const_QMap<QByteArray,_QDBusMetaObjectGenerator::Method>_>,_2UL>
  *__range1;
  qsizetype data_size;
  QDBusMetaObjectPrivate *header;
  qsizetype methodParametersDataSize;
  const_key_value_iterator __end1_3;
  const_key_value_iterator __begin1_3;
  QByteArray typeName;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  QMetaStringTable strings;
  const_iterator __end2;
  const_iterator __begin2;
  QString className;
  array<std::reference_wrapper<const_QMap<QByteArray,_QDBusMetaObjectGenerator::Method>_>,_2UL>
  methodMaps;
  QVarLengthArray<unsigned_int,_256LL> idata;
  QString *in_stack_fffffffffffff828;
  void *__dest;
  const_iterator in_stack_fffffffffffff830;
  const_iterator in_stack_fffffffffffff838;
  QByteArray *pQVar33;
  QMap<QByteArray,_QDBusMetaObjectGenerator::Method> *in_stack_fffffffffffff840;
  QVarLengthArray<unsigned_int,_256LL> *this_01;
  undefined4 in_stack_fffffffffffff848;
  value_type_conflict1 in_stack_fffffffffffff84c;
  QMetaType *local_720;
  long local_698;
  uint local_690;
  uint local_68c;
  long local_688;
  reference_wrapper<const_QMap<QByteArray,_QDBusMetaObjectGenerator::Method>_> *local_658;
  long local_648;
  int local_63c;
  reference_wrapper<const_QMap<QByteArray,_QDBusMetaObjectGenerator::Method>_> *local_608;
  ulong local_5f8;
  long local_5f0;
  reference_wrapper<const_QMap<QByteArray,_QDBusMetaObjectGenerator::Method>_> *local_5b0;
  char *local_578;
  SuperData local_558;
  QMetaType local_550;
  QMetaType local_548;
  pair<const_QByteArray_&,_const_QDBusMetaObjectGenerator::Property_&> local_540;
  const_iterator local_530;
  _Base_ptr local_528;
  const_iterator local_520;
  const_iterator local_518;
  QKeyValueRangeStorage<const_QMap<QByteArray,_QDBusMetaObjectGenerator::Property>_&> local_510;
  QMetaType local_508;
  QMetaType local_500;
  QByteArray local_4f8;
  long local_4e0;
  longlong local_4d8;
  const_iterator local_4d0;
  const_iterator local_4c8;
  long local_4c0;
  longlong local_4b8;
  const_iterator local_4b0;
  const_iterator local_4a8;
  QByteArray local_4a0;
  QByteArray local_488;
  const_iterator local_460;
  const_iterator local_458;
  QFlagsStorageHelper<QtMocConstants::MetaObjectFlag,_4> local_450;
  QChar local_44a;
  QString local_448;
  undefined1 *local_430;
  undefined1 *local_428;
  QVarLengthArray<unsigned_int,_256LL> local_420;
  long local_8;
  
  puVar30 = (undefined8 *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_448.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_448.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_448.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)in_stack_fffffffffffff830._M_node,in_stack_fffffffffffff828);
  QChar::QChar<char16_t,_true>(&local_44a,L'.');
  QVar31 = Qt::Literals::StringLiterals::operator____L1
                     ((char *)in_stack_fffffffffffff838._M_node,
                      (size_t)in_stack_fffffffffffff830._M_node);
  local_578 = (char *)QVar31.m_size;
  QVar32.m_size = (ulong)(ushort)local_44a.ucs;
  QVar32.m_data = local_578;
  QString::replace((QChar)(char16_t)&local_448,QVar32,(CaseSensitivity)QVar31.m_data);
  bVar4 = QString::isEmpty((QString *)0x1ad248);
  if (bVar4) {
    QVar31 = Qt::Literals::StringLiterals::operator____L1
                       ((char *)in_stack_fffffffffffff838._M_node,
                        (size_t)in_stack_fffffffffffff830._M_node);
    QString::operator=(&local_448,QVar31);
  }
  memset(&local_420,0xaa,0x418);
  QVarLengthArray<unsigned_int,_256LL>::QVarLengthArray(&local_420);
  QVarLengthArray<unsigned_int,_256LL>::resize
            ((QVarLengthArray<unsigned_int,_256LL> *)in_stack_fffffffffffff830._M_node,
             (qsizetype)in_stack_fffffffffffff828);
  qVar9 = aggregateParameterCount
                    ((MethodMap *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
  qVar10 = aggregateParameterCount
                     ((MethodMap *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
  sVar11 = QMap<QByteArray,_QDBusMetaObjectGenerator::Method>::size
                     ((QMap<QByteArray,_QDBusMetaObjectGenerator::Method> *)
                      in_stack_fffffffffffff830._M_node);
  sVar12 = QMap<QByteArray,_QDBusMetaObjectGenerator::Method>::size
                     ((QMap<QByteArray,_QDBusMetaObjectGenerator::Method> *)
                      in_stack_fffffffffffff830._M_node);
  puVar13 = QVLABase<unsigned_int>::data(&local_420.super_QVLABase<unsigned_int>);
  *puVar13 = 0xd;
  puVar13[1] = 0;
  puVar13[2] = 0;
  puVar13[3] = 0;
  sVar14 = QMap<QByteArray,_QDBusMetaObjectGenerator::Method>::size
                     ((QMap<QByteArray,_QDBusMetaObjectGenerator::Method> *)
                      in_stack_fffffffffffff830._M_node);
  sVar15 = QMap<QByteArray,_QDBusMetaObjectGenerator::Method>::size
                     ((QMap<QByteArray,_QDBusMetaObjectGenerator::Method> *)
                      in_stack_fffffffffffff830._M_node);
  puVar13[4] = (int)sVar14 + (int)sVar15;
  sVar16 = QVLABaseBase::size((QVLABaseBase *)&local_420);
  puVar13[5] = (uint)sVar16;
  sVar14 = QMap<QByteArray,_QDBusMetaObjectGenerator::Property>::size
                     ((QMap<QByteArray,_QDBusMetaObjectGenerator::Property> *)
                      in_stack_fffffffffffff830._M_node);
  puVar13[6] = (uint)sVar14;
  puVar13[7] = puVar13[5] + puVar13[4] * 6 +
               ((((int)qVar9 + (int)qVar10) * 2 - (int)sVar11) - (int)sVar12);
  puVar13[8] = 0;
  puVar13[9] = 0;
  puVar13[10] = 0;
  puVar13[0xb] = 0;
  local_450.super_QFlagsStorage<QtMocConstants::MetaObjectFlag>.i =
       (QFlagsStorage<QtMocConstants::MetaObjectFlag>)
       operator|((enum_type)((ulong)in_stack_fffffffffffff830._M_node >> 0x20),
                 (enum_type)in_stack_fffffffffffff830._M_node);
  IVar5 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_450);
  puVar13[0xc] = IVar5;
  sVar11 = QMap<QByteArray,_QDBusMetaObjectGenerator::Method>::size
                     ((QMap<QByteArray,_QDBusMetaObjectGenerator::Method> *)
                      in_stack_fffffffffffff830._M_node);
  puVar13[0xd] = (uint)sVar11;
  puVar13[0xe] = puVar13[7] + puVar13[6] * 5;
  puVar13[0xf] = puVar13[0xe] + puVar13[6] * 2;
  QVLABaseBase::size((QVLABaseBase *)&local_420);
  local_430 = &DAT_aaaaaaaaaaaaaaaa;
  local_428 = &DAT_aaaaaaaaaaaaaaaa;
  std::reference_wrapper<QMap<QByteArray,QDBusMetaObjectGenerator::Method>const>::
  reference_wrapper<QMap<QByteArray,QDBusMetaObjectGenerator::Method>&,void,QMap<QByteArray,QDBusMetaObjectGenerator::Method>const*>
            ((reference_wrapper<const_QMap<QByteArray,_QDBusMetaObjectGenerator::Method>_> *)
             in_stack_fffffffffffff830._M_node,
             (QMap<QByteArray,_QDBusMetaObjectGenerator::Method> *)in_stack_fffffffffffff828);
  std::reference_wrapper<QMap<QByteArray,QDBusMetaObjectGenerator::Method>const>::
  reference_wrapper<QMap<QByteArray,QDBusMetaObjectGenerator::Method>&,void,QMap<QByteArray,QDBusMetaObjectGenerator::Method>const*>
            ((reference_wrapper<const_QMap<QByteArray,_QDBusMetaObjectGenerator::Method>_> *)
             in_stack_fffffffffffff830._M_node,
             (QMap<QByteArray,_QDBusMetaObjectGenerator::Method> *)in_stack_fffffffffffff828);
  local_5b0 = std::
              array<std::reference_wrapper<const_QMap<QByteArray,_QDBusMetaObjectGenerator::Method>_>,_2UL>
              ::begin((array<std::reference_wrapper<const_QMap<QByteArray,_QDBusMetaObjectGenerator::Method>_>,_2UL>
                       *)0x1ad5e3);
  pvVar17 = std::
            array<std::reference_wrapper<const_QMap<QByteArray,_QDBusMetaObjectGenerator::Method>_>,_2UL>
            ::end((array<std::reference_wrapper<const_QMap<QByteArray,_QDBusMetaObjectGenerator::Method>_>,_2UL>
                   *)0x1ad5f8);
  for (; local_5b0 != pvVar17; local_5b0 = local_5b0 + 1) {
    std::reference_wrapper<const_QMap<QByteArray,_QDBusMetaObjectGenerator::Method>_>::get
              (local_5b0);
    local_458._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
    local_458._M_node =
         (_Base_ptr)
         QMap<QByteArray,_QDBusMetaObjectGenerator::Method>::begin(in_stack_fffffffffffff840);
    local_460._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
    local_460._M_node =
         (_Base_ptr)
         QMap<QByteArray,_QDBusMetaObjectGenerator::Method>::end(in_stack_fffffffffffff840);
    while (bVar4 = ::operator!=((const_iterator *)in_stack_fffffffffffff830._M_node,
                                (const_iterator *)in_stack_fffffffffffff828), bVar4) {
      pMVar18 = QMap<QByteArray,_QDBusMetaObjectGenerator::Method>::const_iterator::operator*
                          ((const_iterator *)0x1ad6e4);
      QVLABaseBase::size((QVLABaseBase *)&pMVar18->inputTypes);
      QVLABaseBase::size((QVLABaseBase *)&pMVar18->outputTypes);
      QMap<QByteArray,_QDBusMetaObjectGenerator::Method>::const_iterator::operator++
                ((const_iterator *)in_stack_fffffffffffff830._M_node);
    }
  }
  QVarLengthArray<unsigned_int,_256LL>::resize
            ((QVarLengthArray<unsigned_int,_256LL> *)in_stack_fffffffffffff830._M_node,
             (qsizetype)in_stack_fffffffffffff828);
  memset(&local_488,0xaa,0x28);
  QString::toLatin1(in_stack_fffffffffffff828);
  QMetaStringTable::QMetaStringTable((QMetaStringTable *)&local_488,&local_4a0);
  QByteArray::~QByteArray((QByteArray *)0x1ad7cc);
  vVar7 = puVar13[5] + puVar13[4] * 6;
  local_5f0 = (long)(int)puVar13[0xf] + (long)(int)puVar13[4] * 2 + 1;
  pvVar19 = QVLABase<unsigned_int>::operator[]
                      ((QVLABase<unsigned_int> *)in_stack_fffffffffffff828,0x1ad860);
  *pvVar19 = 0;
  sVar11 = QMap<QByteArray,_QDBusMetaObjectGenerator::Property>::size
                     ((QMap<QByteArray,_QDBusMetaObjectGenerator::Property> *)
                      in_stack_fffffffffffff830._M_node);
  local_5f8 = sVar11 + 1;
  local_608 = std::
              array<std::reference_wrapper<const_QMap<QByteArray,_QDBusMetaObjectGenerator::Method>_>,_2UL>
              ::begin((array<std::reference_wrapper<const_QMap<QByteArray,_QDBusMetaObjectGenerator::Method>_>,_2UL>
                       *)0x1ad8c2);
  pvVar17 = std::
            array<std::reference_wrapper<const_QMap<QByteArray,_QDBusMetaObjectGenerator::Method>_>,_2UL>
            ::end((array<std::reference_wrapper<const_QMap<QByteArray,_QDBusMetaObjectGenerator::Method>_>,_2UL>
                   *)0x1ad8d7);
  for (; local_608 != pvVar17; local_608 = local_608 + 1) {
    std::reference_wrapper<const_QMap<QByteArray,_QDBusMetaObjectGenerator::Method>_>::get
              (local_608);
    local_4a8._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
    local_4a8._M_node =
         (_Base_ptr)
         QMap<QByteArray,_QDBusMetaObjectGenerator::Method>::begin(in_stack_fffffffffffff840);
    local_4b0._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
    local_4b0._M_node =
         (_Base_ptr)
         QMap<QByteArray,_QDBusMetaObjectGenerator::Method>::end(in_stack_fffffffffffff840);
    while (bVar4 = ::operator!=((const_iterator *)in_stack_fffffffffffff830._M_node,
                                (const_iterator *)in_stack_fffffffffffff828), bVar4) {
      pMVar18 = QMap<QByteArray,_QDBusMetaObjectGenerator::Method>::const_iterator::operator*
                          ((const_iterator *)0x1ad9c3);
      sVar16 = QVLABaseBase::size((QVLABaseBase *)&pMVar18->inputTypes);
      local_4b8 = 0;
      sVar20 = QVLABaseBase::size((QVLABaseBase *)&pMVar18->outputTypes);
      local_4c0 = sVar20 + -1;
      plVar21 = qMax<long_long>(&local_4b8,&local_4c0);
      local_5f8 = sVar16 + *plVar21 + 1 + local_5f8;
      QMap<QByteArray,_QDBusMetaObjectGenerator::Method>::const_iterator::operator++
                ((const_iterator *)in_stack_fffffffffffff830._M_node);
    }
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_5f8;
  uVar22 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar22 = 0xffffffffffffffff;
  }
  pQVar23 = (QMetaType *)operator_new__(uVar22);
  if (local_5f8 != 0) {
    local_720 = pQVar23;
    do {
      QMetaType::QMetaType(local_720);
      local_720 = local_720 + 1;
    } while (local_720 != pQVar23 + local_5f8);
  }
  local_63c = 0;
  sVar11 = QMap<QByteArray,_QDBusMetaObjectGenerator::Property>::size
                     ((QMap<QByteArray,_QDBusMetaObjectGenerator::Property> *)
                      in_stack_fffffffffffff830._M_node);
  local_648 = sVar11 + 1;
  local_658 = std::
              array<std::reference_wrapper<const_QMap<QByteArray,_QDBusMetaObjectGenerator::Method>_>,_2UL>
              ::begin((array<std::reference_wrapper<const_QMap<QByteArray,_QDBusMetaObjectGenerator::Method>_>,_2UL>
                       *)0x1adb92);
  pvVar17 = std::
            array<std::reference_wrapper<const_QMap<QByteArray,_QDBusMetaObjectGenerator::Method>_>,_2UL>
            ::end((array<std::reference_wrapper<const_QMap<QByteArray,_QDBusMetaObjectGenerator::Method>_>,_2UL>
                   *)0x1adba7);
  for (; local_658 != pvVar17; local_658 = local_658 + 1) {
    std::reference_wrapper<const_QMap<QByteArray,_QDBusMetaObjectGenerator::Method>_>::get
              (local_658);
    local_4c8._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
    local_4c8._M_node =
         (_Base_ptr)
         QMap<QByteArray,_QDBusMetaObjectGenerator::Method>::begin(in_stack_fffffffffffff840);
    local_4d0._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
    local_4d0._M_node =
         (_Base_ptr)
         QMap<QByteArray,_QDBusMetaObjectGenerator::Method>::end(in_stack_fffffffffffff840);
    while (bVar4 = ::operator!=((const_iterator *)in_stack_fffffffffffff830._M_node,
                                (const_iterator *)in_stack_fffffffffffff828), bVar4) {
      pMVar18 = QMap<QByteArray,_QDBusMetaObjectGenerator::Method>::const_iterator::operator*
                          ((const_iterator *)0x1adc93);
      sVar16 = QVLABaseBase::size((QVLABaseBase *)&pMVar18->inputTypes);
      local_4d8 = 0;
      sVar20 = QVLABaseBase::size((QVLABaseBase *)&pMVar18->outputTypes);
      local_4e0 = sVar20 + -1;
      plVar21 = qMax<long_long>(&local_4d8,&local_4e0);
      lVar24 = sVar16 + *plVar21;
      vVar6 = QMetaStringTable::enter(&local_488);
      pvVar19 = QVLABase<unsigned_int>::operator[]
                          ((QVLABase<unsigned_int> *)in_stack_fffffffffffff828,0x1add4c);
      *pvVar19 = vVar6;
      pvVar19 = QVLABase<unsigned_int>::operator[]
                          ((QVLABase<unsigned_int> *)in_stack_fffffffffffff828,0x1add88);
      *pvVar19 = (value_type_conflict1)lVar24;
      pvVar19 = QVLABase<unsigned_int>::operator[]
                          ((QVLABase<unsigned_int> *)in_stack_fffffffffffff828,0x1addc4);
      *pvVar19 = vVar7;
      vVar6 = QMetaStringTable::enter(&local_488);
      pvVar19 = QVLABase<unsigned_int>::operator[]
                          ((QVLABase<unsigned_int> *)in_stack_fffffffffffff828,0x1ade11);
      *pvVar19 = vVar6;
      qVar1 = pMVar18->flags;
      pvVar19 = QVLABase<unsigned_int>::operator[]
                          ((QVLABase<unsigned_int> *)in_stack_fffffffffffff828,0x1ade53);
      *pvVar19 = qVar1;
      pvVar19 = QVLABase<unsigned_int>::operator[]
                          ((QVLABase<unsigned_int> *)in_stack_fffffffffffff828,0x1ade8f);
      *pvVar19 = (value_type_conflict1)local_648;
      for (local_688 = -1; local_688 < lVar24; local_688 = local_688 + 1) {
        local_4f8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_4f8.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
        local_4f8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        QByteArray::QByteArray((QByteArray *)0x1adeff);
        if (local_688 < 0) {
          bVar4 = QVarLengthArray<int,_4LL>::isEmpty((QVarLengthArray<int,_4LL> *)0x1adf1b);
          if (bVar4) {
            local_68c = 0x2b;
          }
          else {
            puVar13 = (uint *)QVarLengthArray<int,_4LL>::first
                                        ((QVarLengthArray<int,_4LL> *)0x1adf30);
            local_68c = *puVar13;
            if (local_68c == 0xffffffff) {
              local_68c = QMetaStringTable::enter(&local_488);
              local_68c = local_68c | 0x80000000;
            }
          }
        }
        else {
          sVar16 = QVLABaseBase::size((QVLABaseBase *)&pMVar18->inputTypes);
          if (local_688 < sVar16) {
            puVar13 = (uint *)QVarLengthArray<int,_4LL>::at
                                        ((QVarLengthArray<int,_4LL> *)
                                         in_stack_fffffffffffff830._M_node,
                                         (qsizetype)in_stack_fffffffffffff828);
            local_68c = *puVar13;
          }
          else {
            QVLABaseBase::size((QVLABaseBase *)&pMVar18->inputTypes);
            piVar25 = QVarLengthArray<int,_4LL>::at
                                ((QVarLengthArray<int,_4LL> *)in_stack_fffffffffffff830._M_node,
                                 (qsizetype)in_stack_fffffffffffff828);
            QMetaType::QMetaType(&local_500,*piVar25);
            pcVar26 = QMetaType::name(&local_500);
            QByteArray::operator=(&local_4f8,pcVar26);
            QByteArray::append((char)&local_4f8);
            local_68c = 0;
          }
        }
        bVar4 = QByteArray::isEmpty((QByteArray *)0x1ae08b);
        if (bVar4) {
          local_690 = local_68c;
        }
        else {
          local_690 = QMetaStringTable::enter(&local_488);
          local_690 = local_690 | 0x80000000;
        }
        QMetaType::QMetaType(&local_508,local_68c);
        pQVar23[local_648].d_ptr = local_508.d_ptr;
        vVar7 = vVar7 + 1;
        pvVar19 = QVLABase<unsigned_int>::operator[]
                            ((QVLABase<unsigned_int> *)in_stack_fffffffffffff828,0x1ae12e);
        *pvVar19 = local_690;
        QByteArray::~QByteArray((QByteArray *)0x1ae141);
        local_648 = local_648 + 1;
      }
      for (local_698 = 0; local_698 < lVar24; local_698 = local_698 + 1) {
        QList<QByteArray>::at
                  ((QList<QByteArray> *)in_stack_fffffffffffff830._M_node,
                   (qsizetype)in_stack_fffffffffffff828);
        vVar6 = QMetaStringTable::enter(&local_488);
        vVar7 = vVar7 + 1;
        pvVar19 = QVLABase<unsigned_int>::operator[]
                            ((QVLABase<unsigned_int> *)in_stack_fffffffffffff828,0x1ae1c5);
        *pvVar19 = vVar6;
      }
      pvVar19 = QVLABase<unsigned_int>::operator[]
                          ((QVLABase<unsigned_int> *)in_stack_fffffffffffff828,0x1ae211);
      *pvVar19 = (value_type_conflict1)local_5f0;
      sVar16 = QVLABaseBase::size((QVLABaseBase *)&pMVar18->inputTypes);
      pvVar19 = QVLABase<unsigned_int>::operator[]
                          ((QVLABase<unsigned_int> *)in_stack_fffffffffffff828,0x1ae250);
      *pvVar19 = (value_type_conflict1)sVar16;
      puVar13 = QVLABase<unsigned_int>::data(&local_420.super_QVLABase<unsigned_int>);
      piVar25 = QVLABase<int>::data(&(pMVar18->inputTypes).super_QVLABase<int>);
      sVar16 = QVLABaseBase::size((QVLABaseBase *)&pMVar18->inputTypes);
      memcpy(puVar13 + local_5f0 + 1,piVar25,sVar16 << 2);
      sVar16 = QVLABaseBase::size((QVLABaseBase *)&pMVar18->inputTypes);
      local_5f0 = sVar16 + local_5f0 + 1;
      pvVar19 = QVLABase<unsigned_int>::operator[]
                          ((QVLABase<unsigned_int> *)in_stack_fffffffffffff828,0x1ae305);
      *pvVar19 = (value_type_conflict1)local_5f0;
      sVar16 = QVLABaseBase::size((QVLABaseBase *)&pMVar18->outputTypes);
      local_5f0 = local_5f0 + 1;
      pvVar19 = QVLABase<unsigned_int>::operator[]
                          ((QVLABase<unsigned_int> *)in_stack_fffffffffffff828,0x1ae344);
      *pvVar19 = (value_type_conflict1)sVar16;
      puVar13 = QVLABase<unsigned_int>::data(&local_420.super_QVLABase<unsigned_int>);
      piVar25 = QVLABase<int>::data(&(pMVar18->outputTypes).super_QVLABase<int>);
      sVar16 = QVLABaseBase::size((QVLABaseBase *)&pMVar18->outputTypes);
      memcpy(puVar13 + local_5f0,piVar25,sVar16 << 2);
      sVar16 = QVLABaseBase::size((QVLABaseBase *)&pMVar18->outputTypes);
      local_5f0 = sVar16 + local_5f0;
      QMap<QByteArray,_QDBusMetaObjectGenerator::Method>::const_iterator::operator++
                ((const_iterator *)in_stack_fffffffffffff830._M_node);
    }
  }
  local_510.m_map =
       (QMap<QByteArray,_QDBusMetaObjectGenerator::Property> *)
       QMap<QByteArray,_QDBusMetaObjectGenerator::Property>::asKeyValueRange
                 ((QMap<QByteArray,_QDBusMetaObjectGenerator::Property> *)
                  in_stack_fffffffffffff830._M_node);
  local_518._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
  local_518._M_node =
       (_Base_ptr)
       QtPrivate::QKeyValueRange<const_QMap<QByteArray,_QDBusMetaObjectGenerator::Property>_&>::
       begin((QKeyValueRange<const_QMap<QByteArray,_QDBusMetaObjectGenerator::Property>_&> *)
             in_stack_fffffffffffff828);
  local_520.i._M_node = (const_iterator)&DAT_aaaaaaaaaaaaaaaa;
  local_520.i._M_node =
       (const_iterator)
       QtPrivate::QKeyValueRange<const_QMap<QByteArray,_QDBusMetaObjectGenerator::Property>_&>::end
                 ((QKeyValueRange<const_QMap<QByteArray,_QDBusMetaObjectGenerator::Property>_&> *)
                  in_stack_fffffffffffff828);
  while( true ) {
    local_528 = local_518._M_node;
    local_530 = local_520.i._M_node;
    bVar4 = ::operator!=((QKeyValueIterator<const_QByteArray_&,_const_QDBusMetaObjectGenerator::Property_&,_QMap<QByteArray,_QDBusMetaObjectGenerator::Property>::const_iterator>
                          )in_stack_fffffffffffff838._M_node,
                         (QKeyValueIterator<const_QByteArray_&,_const_QDBusMetaObjectGenerator::Property_&,_QMap<QByteArray,_QDBusMetaObjectGenerator::Property>::const_iterator>
                          )in_stack_fffffffffffff830._M_node);
    if (!bVar4) break;
    local_540 = QKeyValueIterator<const_QByteArray_&,_const_QDBusMetaObjectGenerator::Property_&,_QMap<QByteArray,_QDBusMetaObjectGenerator::Property>::const_iterator>
                ::operator*((QKeyValueIterator<const_QByteArray_&,_const_QDBusMetaObjectGenerator::Property_&,_QMap<QByteArray,_QDBusMetaObjectGenerator::Property>::const_iterator>
                             *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
    std::get<0ul,QByteArray_const&,QDBusMetaObjectGenerator::Property_const&>
              ((pair<const_QByteArray_&,_const_QDBusMetaObjectGenerator::Property_&> *)0x1ae541);
    pPVar27 = std::get<1ul,QByteArray_const&,QDBusMetaObjectGenerator::Property_const&>
                        ((pair<const_QByteArray_&,_const_QDBusMetaObjectGenerator::Property_&> *)
                         0x1ae568);
    in_stack_fffffffffffff84c = QMetaStringTable::enter(&local_488);
    pvVar19 = QVLABase<unsigned_int>::operator[]
                        ((QVLABase<unsigned_int> *)in_stack_fffffffffffff828,0x1ae5ad);
    *pvVar19 = in_stack_fffffffffffff84c;
    vVar7 = pPVar27->type;
    pvVar19 = QVLABase<unsigned_int>::operator[]
                        ((QVLABase<unsigned_int> *)in_stack_fffffffffffff828,0x1ae5e6);
    *pvVar19 = vVar7;
    qVar1 = pPVar27->flags;
    pvVar19 = QVLABase<unsigned_int>::operator[]
                        ((QVLABase<unsigned_int> *)in_stack_fffffffffffff828,0x1ae61f);
    *pvVar19 = qVar1;
    pvVar19 = QVLABase<unsigned_int>::operator[]
                        ((QVLABase<unsigned_int> *)in_stack_fffffffffffff828,0x1ae649);
    *pvVar19 = 0xffffffff;
    pvVar19 = QVLABase<unsigned_int>::operator[]
                        ((QVLABase<unsigned_int> *)in_stack_fffffffffffff828,0x1ae673);
    *pvVar19 = 0;
    vVar7 = QMetaStringTable::enter(&local_488);
    pvVar19 = QVLABase<unsigned_int>::operator[]
                        ((QVLABase<unsigned_int> *)in_stack_fffffffffffff828,0x1ae6ba);
    *pvVar19 = vVar7;
    vVar7 = pPVar27->type;
    pvVar19 = QVLABase<unsigned_int>::operator[]
                        ((QVLABase<unsigned_int> *)in_stack_fffffffffffff828,0x1ae6f3);
    *pvVar19 = vVar7;
    QMetaType::QMetaType(&local_548,pPVar27->type);
    pQVar23[local_63c].d_ptr = local_548.d_ptr;
    QKeyValueIterator<const_QByteArray_&,_const_QDBusMetaObjectGenerator::Property_&,_QMap<QByteArray,_QDBusMetaObjectGenerator::Property>::const_iterator>
    ::operator++((QKeyValueIterator<const_QByteArray_&,_const_QDBusMetaObjectGenerator::Property_&,_QMap<QByteArray,_QDBusMetaObjectGenerator::Property>::const_iterator>
                  *)in_stack_fffffffffffff830._M_node);
    local_63c = local_63c + 1;
  }
  local_550.d_ptr = (QMetaTypeInterface *)0x0;
  QMetaType::QMetaType(&local_550);
  pQVar23[local_63c].d_ptr = local_550.d_ptr;
  pQVar33 = &local_488;
  iVar8 = QMetaStringTable::blobSize();
  pvVar28 = operator_new__((long)iVar8);
  QMetaStringTable::writeBlob((char *)pQVar33);
  this_01 = &local_420;
  uVar22 = QVLABaseBase::size((QVLABaseBase *)this_01);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar22;
  uVar22 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar22 = 0xffffffffffffffff;
  }
  pvVar29 = operator_new__(uVar22);
  __dest = pvVar29;
  this_00 = (QVarLengthArray<unsigned_int,_256LL> *)
            QVLABase<unsigned_int>::data(&this_01->super_QVLABase<unsigned_int>);
  sVar16 = QVLABaseBase::size((QVLABaseBase *)this_01);
  memcpy(__dest,this_00,sVar16 << 2);
  puVar30[2] = pvVar29;
  puVar30[4] = 0;
  puVar30[3] = 0;
  puVar30[6] = 0;
  puVar30[1] = pvVar28;
  QMetaObject::SuperData::SuperData(&local_558,&QDBusAbstractInterface::staticMetaObject);
  *puVar30 = local_558.direct;
  puVar30[5] = pQVar23;
  QMetaStringTable::~QMetaStringTable((QMetaStringTable *)this_00);
  QVarLengthArray<unsigned_int,_256LL>::~QVarLengthArray(this_00);
  QString::~QString((QString *)0x1ae8d9);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void QDBusMetaObjectGenerator::write(QDBusMetaObject *obj)
{
    // this code here is mostly copied from qaxbase.cpp
    // with a few modifications to make it cleaner

    QString className = interface;
    className.replace(u'.', "::"_L1);
    if (className.isEmpty())
        className = "QDBusInterface"_L1;

    QVarLengthArray<uint> idata;
    idata.resize(sizeof(QDBusMetaObjectPrivate) / sizeof(uint));

    qsizetype methodParametersDataSize =
            ((aggregateParameterCount(signals_)
             + aggregateParameterCount(methods)) * 2) // types and parameter names
            - signals_.size() // return "parameters" don't have names
            - methods.size(); // ditto

    QDBusMetaObjectPrivate *header = reinterpret_cast<QDBusMetaObjectPrivate *>(idata.data());
    static_assert(QMetaObjectPrivate::OutputRevision == 13, "QtDBus meta-object generator should generate the same version as moc");
    header->revision = QMetaObjectPrivate::OutputRevision;
    header->className = 0;
    header->classInfoCount = 0;
    header->classInfoData = 0;
    header->methodCount = int(signals_.size() + methods.size());
    header->methodData = int(idata.size());
    header->propertyCount = int(properties.size());
    header->propertyData = int(header->methodData + header->methodCount *
                               QMetaObjectPrivate::IntsPerMethod + methodParametersDataSize);
    header->enumeratorCount = 0;
    header->enumeratorData = 0;
    header->constructorCount = 0;
    header->constructorData = 0;
    header->flags = RequiresVariantMetaObject | AllocatedMetaObject;
    header->signalCount = signals_.size();
    // These are specific to QDBusMetaObject:
    header->propertyDBusData = int(header->propertyData + header->propertyCount
                                   * QMetaObjectPrivate::IntsPerProperty);
    header->methodDBusData = int(header->propertyDBusData + header->propertyCount * intsPerProperty);

    qsizetype data_size = idata.size() +
                    (header->methodCount * (QMetaObjectPrivate::IntsPerMethod+intsPerMethod)) + methodParametersDataSize +
                    (header->propertyCount * (QMetaObjectPrivate::IntsPerProperty+intsPerProperty));

    // Signals must be added before other methods, to match moc.
    std::array<std::reference_wrapper<const MethodMap>, 2> methodMaps = { signals_, methods };

    for (const auto &methodMap : methodMaps) {
        for (const Method &mm : methodMap.get())
            data_size += 2 + mm.inputTypes.size() + mm.outputTypes.size();
    }
    idata.resize(data_size + 1);

    QMetaStringTable strings(className.toLatin1());

    qsizetype offset = header->methodData;
    qsizetype parametersOffset = offset + header->methodCount * QMetaObjectPrivate::IntsPerMethod;
    qsizetype signatureOffset = header->methodDBusData;
    qsizetype typeidOffset = header->methodDBusData + header->methodCount * intsPerMethod;
    idata[typeidOffset++] = 0;                           // eod

    qsizetype totalMetaTypeCount = properties.size();
    ++totalMetaTypeCount; // + 1 for metatype of dynamic metaobject
    for (const auto &methodMap : methodMaps) {
        for (const Method &mm : methodMap.get()) {
            qsizetype argc = mm.inputTypes.size() + qMax(qsizetype(0), mm.outputTypes.size() - 1);
            totalMetaTypeCount += argc + 1;
        }
    }
    QMetaType *metaTypes = new QMetaType[totalMetaTypeCount];
    int propertyId = 0;

    // add each method:
    qsizetype currentMethodMetaTypeOffset = properties.size() + 1;

    for (const auto &methodMap : methodMaps) {
        for (const Method &mm : methodMap.get()) {
            qsizetype argc = mm.inputTypes.size() + qMax(qsizetype(0), mm.outputTypes.size() - 1);

            idata[offset++] = strings.enter(mm.name);
            idata[offset++] = argc;
            idata[offset++] = parametersOffset;
            idata[offset++] = strings.enter(mm.tag);
            idata[offset++] = mm.flags;
            idata[offset++] = currentMethodMetaTypeOffset;

            // Parameter types
            for (qsizetype i = -1; i < argc; ++i) {
                int type;
                QByteArray typeName;
                if (i < 0) { // Return type
                    if (!mm.outputTypes.isEmpty()) {
                        type = mm.outputTypes.first();
                        if (type == -1) {
                            type = IsUnresolvedType | strings.enter(mm.rawReturnType);
                        }
                    } else {
                        type = QMetaType::Void;
                    }
                } else if (i < mm.inputTypes.size()) {
                    type = mm.inputTypes.at(i);
                } else {
                    Q_ASSERT(mm.outputTypes.size() > 1);
                    type = mm.outputTypes.at(i - mm.inputTypes.size() + 1);
                    // Output parameters are references; type id not available
                    typeName = QMetaType(type).name();
                    typeName.append('&');
                    type = QMetaType::UnknownType;
                }
                int typeInfo;
                if (!typeName.isEmpty())
                    typeInfo = IsUnresolvedType | strings.enter(typeName);
                else
                    typeInfo = type;
                metaTypes[currentMethodMetaTypeOffset++] = QMetaType(type);
                idata[parametersOffset++] = typeInfo;
            }
            // Parameter names
            for (qsizetype i = 0; i < argc; ++i)
                idata[parametersOffset++] = strings.enter(mm.parameterNames.at(i));

            idata[signatureOffset++] = typeidOffset;
            idata[typeidOffset++] = mm.inputTypes.size();
            memcpy(idata.data() + typeidOffset, mm.inputTypes.data(), mm.inputTypes.size() * sizeof(uint));
            typeidOffset += mm.inputTypes.size();

            idata[signatureOffset++] = typeidOffset;
            idata[typeidOffset++] = mm.outputTypes.size();
            memcpy(idata.data() + typeidOffset, mm.outputTypes.data(), mm.outputTypes.size() * sizeof(uint));
            typeidOffset += mm.outputTypes.size();
        }
    }

    Q_ASSERT(offset == header->methodData + header->methodCount * QMetaObjectPrivate::IntsPerMethod);
    Q_ASSERT(parametersOffset == header->propertyData);
    Q_ASSERT(signatureOffset == header->methodDBusData + header->methodCount * intsPerMethod);
    Q_ASSERT(typeidOffset == idata.size());
    offset += methodParametersDataSize;
    Q_ASSERT(offset == header->propertyData);

    // add each property
    signatureOffset = header->propertyDBusData;
    for (const auto &[name, mp] : std::as_const(properties).asKeyValueRange()) {
        // form is name, typeinfo, flags
        idata[offset++] = strings.enter(name);
        Q_ASSERT(mp.type != QMetaType::UnknownType);
        idata[offset++] = mp.type;
        idata[offset++] = mp.flags;
        idata[offset++] = -1; // notify index
        idata[offset++] = 0; // revision

        idata[signatureOffset++] = strings.enter(mp.signature);
        idata[signatureOffset++] = mp.type;

        metaTypes[propertyId++] = QMetaType(mp.type);
    }
    metaTypes[propertyId] = QMetaType(); // we can't know our own metatype

    Q_ASSERT(offset == header->propertyDBusData);
    Q_ASSERT(signatureOffset == header->methodDBusData);

    char *string_data = new char[strings.blobSize()];
    strings.writeBlob(string_data);

    uint *uint_data = new uint[idata.size()];
    memcpy(uint_data, idata.data(), idata.size() * sizeof(uint));

    // put the metaobject together
    obj->d.data = uint_data;
    obj->d.relatedMetaObjects = nullptr;
    obj->d.static_metacall = nullptr;
    obj->d.extradata = nullptr;
    obj->d.stringdata = reinterpret_cast<const uint *>(string_data);
    obj->d.superdata = &QDBusAbstractInterface::staticMetaObject;
    obj->d.metaTypes = reinterpret_cast<QtPrivate::QMetaTypeInterface *const *>(metaTypes);
}